

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void whereIndexExprTrans(Index *pIdx,int iTabCur,int iIdxCur,WhereInfo *pWInfo)

{
  char *pcVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ExprList *pEVar5;
  Table *pTVar6;
  Column *pCVar7;
  code *pcVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  IdxExprTrans x;
  Walker local_b8;
  Walker local_88;
  Expr *local_58;
  int local_50;
  int local_4c;
  undefined4 local_48;
  int local_44;
  WhereInfo *local_40;
  sqlite3 *local_38;
  
  pEVar5 = pIdx->aColExpr;
  if ((pEVar5 != (ExprList *)0x0) || ((pIdx->field_0x64 & 4) != 0)) {
    pTVar6 = pIdx->pTable;
    local_b8.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    local_b8.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    local_b8.pParse = (Parse *)0x0;
    local_b8.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)0x0;
    local_b8.walkerDepth = 0;
    local_b8.eCode = 0;
    local_b8._38_2_ = 0;
    local_b8.u.pNC = (NameContext *)&local_58;
    local_38 = pWInfo->pParse->db;
    if (pIdx->nColumn != 0) {
      uVar12 = 0;
      local_50 = iTabCur;
      local_4c = iIdxCur;
      local_40 = pWInfo;
      do {
        uVar3 = pIdx->aiColumn[uVar12];
        if ((short)uVar3 == -2) {
          local_58 = pEVar5->a[uVar12].pExpr;
          local_88.eCode = 1;
          local_88.xExprCallback = exprNodeIsConstant;
          local_88.xSelectCallback = sqlite3SelectWalkFail;
          local_88.u.n = 0;
          if (local_58 != (Expr *)0x0) {
            walkExpr(&local_88,local_58);
            pcVar8 = whereIndexExprTransNode;
            if (local_88.eCode == 0) {
LAB_0018a531:
              local_48 = (undefined4)uVar12;
              local_b8.xExprCallback = pcVar8;
              if (pWInfo->pWhere != (Expr *)0x0) {
                walkExpr(&local_b8,pWInfo->pWhere);
              }
              sqlite3WalkExprList(&local_b8,pWInfo->pOrderBy);
              sqlite3WalkExprList(&local_b8,pWInfo->pResultSet);
            }
          }
        }
        else if (-1 < (short)uVar3) {
          pCVar7 = pTVar6->aCol;
          uVar4 = pCVar7[uVar3].colFlags;
          if ((uVar4 & 0x20) != 0) {
            bVar13 = (uVar4 >> 9 & 1) != 0;
            if (bVar13) {
              if (bVar13) {
                pcVar9 = pCVar7[uVar3].zCnName + -1;
                do {
                  pcVar10 = pcVar9 + 1;
                  pcVar9 = pcVar9 + 1;
                } while (*pcVar10 != '\0');
                pcVar10 = pcVar9;
                if ((uVar4 & 4) != 0) {
                  do {
                    pcVar9 = pcVar10 + 1;
                    pcVar1 = pcVar10 + 1;
                    pcVar10 = pcVar9;
                  } while (*pcVar1 != '\0');
                }
                pcVar9 = pcVar9 + 1;
              }
              else {
                pcVar9 = (char *)0x0;
              }
              lVar11 = 0;
              do {
                bVar2 = pcVar9[lVar11];
                if (bVar2 == "BINARY"[lVar11]) {
                  if ((ulong)bVar2 == 0) break;
                }
                else if (""[bVar2] != ""[(byte)"BINARY"[lVar11]]) goto LAB_0018a56d;
                lVar11 = lVar11 + 1;
              } while( true );
            }
            pcVar8 = whereIndexExprTransColumn;
            local_44 = (int)(short)uVar3;
            goto LAB_0018a531;
          }
        }
LAB_0018a56d:
        uVar12 = uVar12 + 1;
      } while (uVar12 < pIdx->nColumn);
    }
  }
  return;
}

Assistant:

static void whereIndexExprTrans(
  Index *pIdx,      /* The Index */
  int iTabCur,      /* Cursor of the table that is being indexed */
  int iIdxCur,      /* Cursor of the index itself */
  WhereInfo *pWInfo /* Transform expressions in this WHERE clause */
){
  int iIdxCol;               /* Column number of the index */
  ExprList *aColExpr;        /* Expressions that are indexed */
  Table *pTab;
  Walker w;
  IdxExprTrans x;
  aColExpr = pIdx->aColExpr;
  if( aColExpr==0 && !pIdx->bHasVCol ){
    /* The index does not reference any expressions or virtual columns
    ** so no translations are needed. */
    return;
  }
  pTab = pIdx->pTable;
  memset(&w, 0, sizeof(w));
  w.u.pIdxTrans = &x;
  x.iTabCur = iTabCur;
  x.iIdxCur = iIdxCur;
  x.pWInfo = pWInfo;
  x.db = pWInfo->pParse->db;
  for(iIdxCol=0; iIdxCol<pIdx->nColumn; iIdxCol++){
    i16 iRef = pIdx->aiColumn[iIdxCol];
    if( iRef==XN_EXPR ){
      assert( aColExpr!=0 && aColExpr->a[iIdxCol].pExpr!=0 );
      x.pIdxExpr = aColExpr->a[iIdxCol].pExpr;
      if( sqlite3ExprIsConstant(x.pIdxExpr) ) continue;
      w.xExprCallback = whereIndexExprTransNode;
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
    }else if( iRef>=0
       && (pTab->aCol[iRef].colFlags & COLFLAG_VIRTUAL)!=0
       && ((pTab->aCol[iRef].colFlags & COLFLAG_HASCOLL)==0
           || sqlite3StrICmp(sqlite3ColumnColl(&pTab->aCol[iRef]),
                                               sqlite3StrBINARY)==0)
    ){
      /* Check to see if there are direct references to generated columns
      ** that are contained in the index.  Pulling the generated column
      ** out of the index is an optimization only - the main table is always
      ** available if the index cannot be used.  To avoid unnecessary
      ** complication, omit this optimization if the collating sequence for
      ** the column is non-standard */
      x.iTabCol = iRef;
      w.xExprCallback = whereIndexExprTransColumn;
#endif /* SQLITE_OMIT_GENERATED_COLUMNS */
    }else{
      continue;
    }
    x.iIdxCol = iIdxCol;
    sqlite3WalkExpr(&w, pWInfo->pWhere);
    sqlite3WalkExprList(&w, pWInfo->pOrderBy);
    sqlite3WalkExprList(&w, pWInfo->pResultSet);
  }
}